

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O0

int IsCharIdent(char cChar)

{
  undefined4 local_c;
  char cChar_local;
  
  if ((((cChar < '0') || ('9' < cChar)) && ((cChar < 'A' || ('Z' < cChar)))) &&
     (((cChar < 'a' || ('z' < cChar)) && (cChar != '_')))) {
    local_c = 0;
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int IsCharIdent(char cChar)
{
    if ((cChar >= '0' && cChar <= '9') ||
            (cChar >= 'A' && cChar <= 'Z') ||
            (cChar >= 'a' && cChar <= 'z') ||
            cChar == '_')
        return TRUE;
    else
        return FALSE;
}